

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec,xmlChar *value,void *data)

{
  xmlRegInputTokenPtr pxVar1;
  xmlChar *pxVar2;
  xmlRegInputTokenPtr tmp;
  void *data_local;
  xmlChar *value_local;
  xmlRegExecCtxtPtr exec_local;
  
  if (exec->inputStackMax == 0) {
    exec->inputStackMax = 4;
    pxVar1 = (xmlRegInputTokenPtr)(*xmlMalloc)((long)exec->inputStackMax << 4);
    exec->inputStack = pxVar1;
    if (exec->inputStack == (xmlRegInputTokenPtr)0x0) {
      xmlRegexpErrMemory((xmlRegParserCtxtPtr)0x0,"pushing input string");
      exec->inputStackMax = 0;
      return;
    }
  }
  else if (exec->inputStackMax <= exec->inputStackNr + 1) {
    exec->inputStackMax = exec->inputStackMax << 1;
    pxVar1 = (xmlRegInputTokenPtr)(*xmlRealloc)(exec->inputStack,(long)exec->inputStackMax << 4);
    if (pxVar1 == (xmlRegInputTokenPtr)0x0) {
      xmlRegexpErrMemory((xmlRegParserCtxtPtr)0x0,"pushing input string");
      exec->inputStackMax = exec->inputStackMax / 2;
      return;
    }
    exec->inputStack = pxVar1;
  }
  pxVar2 = xmlStrdup(value);
  exec->inputStack[exec->inputStackNr].value = pxVar2;
  exec->inputStack[exec->inputStackNr].data = data;
  exec->inputStackNr = exec->inputStackNr + 1;
  exec->inputStack[exec->inputStackNr].value = (xmlChar *)0x0;
  exec->inputStack[exec->inputStackNr].data = (void *)0x0;
  return;
}

Assistant:

static void
xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                    void *data) {
#ifdef DEBUG_PUSH
    printf("saving value: %d:%s\n", exec->inputStackNr, value);
#endif
    if (exec->inputStackMax == 0) {
	exec->inputStackMax = 4;
	exec->inputStack = (xmlRegInputTokenPtr)
	    xmlMalloc(exec->inputStackMax * sizeof(xmlRegInputToken));
	if (exec->inputStack == NULL) {
	    xmlRegexpErrMemory(NULL, "pushing input string");
	    exec->inputStackMax = 0;
	    return;
	}
    } else if (exec->inputStackNr + 1 >= exec->inputStackMax) {
	xmlRegInputTokenPtr tmp;

	exec->inputStackMax *= 2;
	tmp = (xmlRegInputTokenPtr) xmlRealloc(exec->inputStack,
			exec->inputStackMax * sizeof(xmlRegInputToken));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(NULL, "pushing input string");
	    exec->inputStackMax /= 2;
	    return;
	}
	exec->inputStack = tmp;
    }
    exec->inputStack[exec->inputStackNr].value = xmlStrdup(value);
    exec->inputStack[exec->inputStackNr].data = data;
    exec->inputStackNr++;
    exec->inputStack[exec->inputStackNr].value = NULL;
    exec->inputStack[exec->inputStackNr].data = NULL;
}